

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogSGMLResolve(xmlCatalogPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogPtr local_30;
  xmlChar *ret;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  xmlCatalogPtr catal_local;
  
  local_30 = (xmlCatalogPtr)0x0;
  if (catal->sgml == (xmlHashTablePtr)0x0) {
    catal_local = (xmlCatalogPtr)0x0;
  }
  else {
    if (pubID != (xmlChar *)0x0) {
      local_30 = (xmlCatalogPtr)xmlCatalogGetSGMLPublic(catal->sgml,pubID);
    }
    if (local_30 == (xmlCatalogPtr)0x0) {
      if (sysID != (xmlChar *)0x0) {
        local_30 = (xmlCatalogPtr)xmlCatalogGetSGMLSystem(catal->sgml,sysID);
      }
      if (local_30 == (xmlCatalogPtr)0x0) {
        catal_local = (xmlCatalogPtr)0x0;
      }
      else {
        catal_local = local_30;
      }
    }
    else {
      catal_local = local_30;
    }
  }
  return (xmlChar *)catal_local;
}

Assistant:

static const xmlChar *
xmlCatalogSGMLResolve(xmlCatalogPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    const xmlChar *ret = NULL;

    if (catal->sgml == NULL)
	return(NULL);

    if (pubID != NULL)
	ret = xmlCatalogGetSGMLPublic(catal->sgml, pubID);
    if (ret != NULL)
	return(ret);
    if (sysID != NULL)
	ret = xmlCatalogGetSGMLSystem(catal->sgml, sysID);
    if (ret != NULL)
	return(ret);
    return(NULL);
}